

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O3

void BQMTester<cimod::Sparse>::test_DenseBQMFunctionTest_add_variable(void)

{
  mapped_type *pmVar1;
  char *pcVar2;
  Linear<uint32_t,_double> bqm_linear;
  BQM<uint32_t,_double,_cimod::Sparse> bqm;
  double offset;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  AssertHelper local_1c8;
  AssertHelper local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  undefined1 local_1b0 [8];
  AssertHelperData *local_1a8;
  AssertHelperData *local_1a0;
  StorageIndex *local_198;
  StorageIndex *local_190;
  CompressedStorage<double,_int> local_188;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_168;
  unsigned_long local_130;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> local_128;
  undefined1 *local_80;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_40;
  
  local_128._quadmat.m_innerSize = 2;
  local_128._quadmat.m_outerIndex = (StorageIndex *)&DAT_3ff0000000000000;
  local_128._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  local_128._quadmat._1_7_ = 0;
  local_128._quadmat.m_outerSize = 0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_40,&local_128,&local_128._quadmat.m_innerNonZeros,0,local_1b0,&local_78,
             &local_168);
  local_128._quadmat.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
  local_128._quadmat._1_7_ = 0x2000000;
  local_128._quadmat.m_outerSize = 0x3fe0000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_78,&local_128,&local_128._quadmat.m_innerSize,0,local_1b0,&local_168,
             &local_1c0);
  local_80 = &DAT_bfe0000000000000;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::BinaryQuadraticModel
            (&local_128,(Linear<unsigned_int,_double> *)&local_40,
             (Quadratic<unsigned_int,_double> *)&local_78,(double *)&local_80,SPIN);
  local_168._M_buckets =
       (__buckets_ptr)
       ((long)local_128._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_128._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2);
  local_1c0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1b0,"bqm.get_num_variables()","2",(unsigned_long *)&local_168,
             (int *)&local_1c0);
  if (local_1b0[0] == false) {
    testing::Message::Message((Message *)&local_168);
    if (local_1a8 == (AssertHelperData *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x117,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_168._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*local_168._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_1a8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  local_168._M_buckets._0_4_ = 2;
  local_1b0 = (undefined1  [8])0x4000000000000000;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&local_128,(uint *)&local_168,(double *)local_1b0);
  local_168._M_buckets._0_4_ = 1;
  local_1b0 = (undefined1  [8])&DAT_3fd51eb851eb851f;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&local_128,(uint *)&local_168,(double *)local_1b0);
  local_168._M_buckets = (__buckets_ptr)((ulong)local_168._M_buckets._4_4_ << 0x20);
  local_1b0 = (undefined1  [8])&DAT_3fd51eb851eb851f;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::add_variable
            (&local_128,(uint *)&local_168,(double *)local_1b0);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::_generate_linear
            ((Linear<unsigned_int,_double> *)&local_168,&local_128);
  local_1c0.data_ =
       (AssertHelperData *)
       ((long)local_128._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_128._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2);
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1b0,"bqm.get_num_variables()","3",(unsigned_long *)&local_1c0,
             (int *)&local_1c8);
  if (local_1b0[0] == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1a8 == (AssertHelperData *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c0.data_ + 8))();
    }
  }
  if (local_1a8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  local_1c8.data_ = local_1c8.data_ & 0xffffffff00000000;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_168,(key_type *)&local_1c8);
  local_1c0.data_ = (AssertHelperData *)&DAT_3fd51eb851eb851f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_1b0,"bqm_linear[0]","0.33",pmVar1,(double *)&local_1c0);
  if (local_1b0[0] == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1a8 == (AssertHelperData *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x122,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c0.data_ + 8))();
    }
  }
  if (local_1a8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  local_1c8.data_._0_4_ = 1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_168,(key_type *)&local_1c8);
  local_1c0.data_ = (AssertHelperData *)&DAT_3fd51eb851eb851f;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_1b0,"bqm_linear[1]","0.33",pmVar1,(double *)&local_1c0);
  if (local_1b0[0] == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1a8 == (AssertHelperData *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x123,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c0.data_ + 8))();
    }
  }
  if (local_1a8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  local_1c8.data_._0_4_ = 2;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_168,(key_type *)&local_1c8);
  local_1c0.data_ = (AssertHelperData *)&DAT_4008000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_1b0,"bqm_linear[2]","3.0",pmVar1,(double *)&local_1c0);
  if (local_1b0[0] == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_1a8 == (AssertHelperData *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a8;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x124,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1c0.data_ + 8))();
    }
  }
  if (local_1a8 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  }
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)local_1b0,&local_128._quadmat);
  local_1c8.data_ = local_1a8;
  local_130 = ((long)local_128._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)&local_1c0,"bqm.interaction_matrix().rows()","bqm.get_num_variables() + 1",
             (long *)&local_1c8,&local_130);
  free(local_198);
  free(local_190);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_188);
  if (local_1c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x127,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1b0 + 8))();
    }
  }
  if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b8,local_1b8);
  }
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)local_1b0,&local_128._quadmat);
  local_1c8.data_ = local_1a0;
  local_130 = ((long)local_128._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_128._idx_to_label.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + 1;
  testing::internal::CmpHelperEQ<long,unsigned_long>
            ((internal *)&local_1c0,"bqm.interaction_matrix().cols()","bqm.get_num_variables() + 1",
             (long *)&local_1c8,&local_130);
  free(local_198);
  free(local_190);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_188);
  if (local_1c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if (local_1b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x128,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1b0 + 8))();
    }
  }
  if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b8,local_1b8);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_168);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128._label_to_idx._M_h);
  if (local_128._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_128._quadmat.m_outerIndex);
  free(local_128._quadmat.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_128._quadmat.m_data);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_78);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_40);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_add_variable()
    {
        Linear<uint32_t, double> linear{ {0, 0.0}, {2, 1.0} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(0, 2), 0.5} };
        double offset = -0.5;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        // check length
        EXPECT_EQ(bqm.get_num_variables(), 2);

        bqm.add_variable(2, 2.0);
        bqm.add_variable(1, 0.33);
        bqm.add_variable(0, 0.33);

        Linear<uint32_t, double> bqm_linear = bqm.get_linear();

        // check length
        EXPECT_EQ(bqm.get_num_variables(), 3);
        // check linear
        EXPECT_EQ(bqm_linear[0], 0.33);
        EXPECT_EQ(bqm_linear[1], 0.33);
        EXPECT_EQ(bqm_linear[2], 3.0);


        EXPECT_EQ(bqm.interaction_matrix().rows(), bqm.get_num_variables() + 1);
        EXPECT_EQ(bqm.interaction_matrix().cols(), bqm.get_num_variables() + 1);
    }